

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word)

{
  undefined1 auVar1 [16];
  pointer piVar2;
  vector<int,_std::allocator<int>_> *__range1;
  pointer piVar3;
  undefined1 in_ZMM0 [64];
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  Dictionary::getSubwords
            ((vector<int,_std::allocator<int>_> *)&local_38,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  piVar2 = local_38._M_impl.super__Vector_impl_data._M_finish;
  for (piVar3 = local_38._M_impl.super__Vector_impl_data._M_start; piVar3 != piVar2;
      piVar3 = piVar3 + 1) {
    addInputVector(this,vec,*piVar3);
  }
  if ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
      (long)local_38._M_impl.super__Vector_impl_data._M_start != 0) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                                (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(vec,(float)(1.0 / auVar1._0_8_));
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int32_t ngram : ngrams) {
    addInputVector(vec, ngram);
  }

  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}